

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O1

void __thiscall
biosoup::test::BiosoupTimerTest_Reset_Test::TestBody(BiosoupTimerTest_Reset_Test *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  char *message;
  char *in_R9;
  double dVar7;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  undefined8 *local_40;
  AssertHelper local_38;
  string local_30;
  
  std::chrono::_V2::steady_clock::now();
  local_30._M_dataplus._M_p = (pointer)0x0;
  local_30._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar3 = nanosleep((timespec *)&local_30,(timespec *)&local_30);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  local_30._M_dataplus._M_p = (pointer)0x0;
  local_30._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar3 = nanosleep((timespec *)&local_30,(timespec *)&local_30);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  lVar5 = std::chrono::_V2::steady_clock::now();
  local_30._M_dataplus._M_p = (char *)0x0;
  local_30._M_string_length = (size_type)&DAT_0f424000;
  do {
    iVar3 = nanosleep((timespec *)&local_30,(timespec *)&local_30);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  if (lVar5 == 0) {
    dVar7 = 0.0;
  }
  else {
    lVar6 = std::chrono::_V2::steady_clock::now();
    dVar7 = (double)(lVar6 - lVar5) / 1000000000.0 + 0.0;
  }
  local_48._M_head_impl._0_1_ = dVar7 <= 0.384 && 0.256 <= dVar7;
  local_40 = (undefined8 *)0x0;
  if (dVar7 > 0.384 || 0.256 > dVar7) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,
               (AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.elapsed_time())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x41,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
    }
  }
  puVar1 = local_40;
  if (local_40 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_40 != local_40 + 2) {
      operator_delete((undefined8 *)*local_40);
    }
    operator_delete(puVar1);
  }
  local_50.data_._0_4_ = 0;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_30,"0","t.elapsed_time()",(int *)&local_50,(double *)&local_48);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x43,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  sVar2 = local_30._M_string_length;
  if ((undefined8 *)local_30._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_30._M_string_length !=
        (undefined8 *)(local_30._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_30._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  return;
}

Assistant:

TEST(BiosoupTimerTest, Stop) {
  Timer t{};
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_EQ(0, t.elapsed_time());
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Stop();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0.512, 0.768, t.elapsed_time()));
}